

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre_test.cc
# Opt level: O3

void __thiscall
TrivialRETest_CompileFailings_Test::TestBody(TrivialRETest_CompileFailings_Test *this)

{
  pointer *this_00;
  size_t sVar1;
  char *pcVar2;
  char *in_R9;
  undefined1 auVar3 [8];
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  string local_f8 [4];
  undefined1 local_68 [8];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  examples;
  allocator_type local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  memcpy(local_f8,&DAT_0015a4b0,0x90);
  __l._M_len = 9;
  __l._M_array = (iterator)local_f8;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)local_68,__l,local_48);
  if (local_68 !=
      (undefined1  [8])
      examples.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = &examples.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    auVar3 = local_68;
    do {
      sVar1 = ((string_view *)auVar3)->_M_len;
      pcVar2 = ((string_view *)auVar3)->_M_str;
      local_48[0] = (allocator_type)CompilationFails(*(string_view *)auVar3);
      local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_48[0]) {
        testing::Message::Message((Message *)&local_38);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_38._M_head_impl + 0x10),"s: ",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_38._M_head_impl + 0x10),pcVar2,sVar1);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (local_f8,(internal *)local_48,(AssertionResult *)"CompilationFails(s)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_00,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre_test.cc"
                   ,0x81,local_f8[0]._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
          operator_delete(local_f8[0]._M_dataplus._M_p,local_f8[0].field_2._M_allocated_capacity + 1
                         );
        }
        if (local_38._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_38._M_head_impl + 8))();
        }
        if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_40,local_40);
        }
      }
      auVar3 = (undefined1  [8])((long)auVar3 + 0x10);
    } while (auVar3 != (undefined1  [8])
                       examples.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    (long)examples.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_68);
  }
  return;
}

Assistant:

TEST(TrivialRETest, CompileFailings) {
  std::vector<std::string_view> examples = {"[", "(", "{}", "((", "\\A", "\\b", "\\S", "\\s", "\\w"};
  for (auto s : examples) {
    EXPECT_TRUE(CompilationFails(s)) << "s: " << s;
  }
}